

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

vector<duckdb::ParserKeyword,_true> * duckdb::Parser::KeywordList(void)

{
  bool bVar1;
  reference pPVar2;
  vector<duckdb::ParserKeyword,_std::allocator<duckdb::ParserKeyword>_> *in_RDI;
  ParserKeyword res;
  PGKeyword *kw;
  iterator __end1;
  iterator __begin1;
  vector<duckdb_libpgquery::PGKeyword,_true> *__range1;
  vector<duckdb_libpgquery::PGKeyword,_true> keywords;
  vector<duckdb::ParserKeyword,_true> *result;
  vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>
  *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  KeywordCategory in_stack_ffffffffffffff67;
  value_type *__x;
  undefined1 in_stack_ffffffffffffffa6;
  __normal_iterator<duckdb_libpgquery::PGKeyword_*,_std::vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>_>
  _Stack_38;
  undefined1 *puStack_30;
  undefined1 uStack_21;
  undefined1 auStack_20 [32];
  
  PostgresParser::KeywordList();
  uStack_21 = 0;
  vector<duckdb::ParserKeyword,_true>::vector((vector<duckdb::ParserKeyword,_true> *)0x2a20f7b);
  puStack_30 = auStack_20;
  _Stack_38._M_current =
       (PGKeyword *)
       ::std::vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>::
       begin(in_stack_ffffffffffffff58);
  ::std::vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>::end
            (in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::
                 operator!=<duckdb_libpgquery::PGKeyword_*,_std::vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>_>
                           ((__normal_iterator<duckdb_libpgquery::PGKeyword_*,_std::vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                            (__normal_iterator<duckdb_libpgquery::PGKeyword_*,_std::vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    pPVar2 = __gnu_cxx::
             __normal_iterator<duckdb_libpgquery::PGKeyword_*,_std::vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>_>
             ::operator*(&_Stack_38);
    __x = (value_type *)&stack0xffffffffffffff90;
    ParserKeyword::ParserKeyword((ParserKeyword *)0x2a20fdc);
    ::std::__cxx11::string::operator=((string *)__x,(string *)pPVar2);
    in_stack_ffffffffffffff67 = ToKeywordCategory(in_stack_ffffffffffffffa6);
    ::std::vector<duckdb::ParserKeyword,_std::allocator<duckdb::ParserKeyword>_>::push_back
              (in_RDI,__x);
    ParserKeyword::~ParserKeyword((ParserKeyword *)0x2a21024);
    __gnu_cxx::
    __normal_iterator<duckdb_libpgquery::PGKeyword_*,_std::vector<duckdb_libpgquery::PGKeyword,_std::allocator<duckdb_libpgquery::PGKeyword>_>_>
    ::operator++(&_Stack_38);
  }
  uStack_21 = 1;
  vector<duckdb_libpgquery::PGKeyword,_true>::~vector
            ((vector<duckdb_libpgquery::PGKeyword,_true> *)0x2a2108d);
  return (vector<duckdb::ParserKeyword,_true> *)in_RDI;
}

Assistant:

vector<ParserKeyword> Parser::KeywordList() {
	auto keywords = PostgresParser::KeywordList();
	vector<ParserKeyword> result;
	for (auto &kw : keywords) {
		ParserKeyword res;
		res.name = kw.text;
		res.category = ToKeywordCategory(kw.category);
		result.push_back(res);
	}
	return result;
}